

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auth_mac.c
# Opt level: O0

Qiniu_Error
Qiniu_For_Each_Header
          (Qiniu_Header *header,_func_Qiniu_Error_Qiniu_Header_ptr_void_ptr *for_each,void *data)

{
  Qiniu_Error QVar1;
  undefined8 extraout_RDX;
  Qiniu_Header *local_38;
  Qiniu_Header *cur_header;
  void *data_local;
  _func_Qiniu_Error_Qiniu_Header_ptr_void_ptr *for_each_local;
  Qiniu_Header *header_local;
  Qiniu_Error err;
  
  for (local_38 = header; local_38 != (Qiniu_Header *)0x0; local_38 = local_38->next) {
    QVar1.code = (*for_each)(local_38,data);
    header_local = (Qiniu_Header *)(ulong)(uint)QVar1.code;
    err._0_8_ = extraout_RDX;
    if (QVar1.code != (Qiniu_Error)0xc8) goto LAB_0012f8c9;
  }
  header_local = (Qiniu_Header *)Qiniu_OK._0_8_;
  err._0_8_ = Qiniu_OK.message;
LAB_0012f8c9:
  QVar1._0_8_ = (ulong)header_local & 0xffffffff;
  QVar1.message = (char *)err._0_8_;
  return QVar1;
}

Assistant:

static Qiniu_Error Qiniu_For_Each_Header(Qiniu_Header *header, Qiniu_Error (*for_each)(Qiniu_Header *header, void *data), void *data)
{
	for (Qiniu_Header *cur_header = header; cur_header != NULL; cur_header = cur_header->next)
	{
		Qiniu_Error err = for_each(cur_header, data);
		if (err.code != 200)
		{
			return err;
		}
	}
	return Qiniu_OK;
}